

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O2

void __thiscall
Index::Index(Index *this,Thread *thread,vector<Comment,_std::allocator<Comment>_> *comments)

{
  _Rb_tree_header *p_Var1;
  pointer pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Comment *comment;
  pointer newComment;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_R8;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_00;
  format_string_t<std::__cxx11::basic_string<char>_> fmt_01;
  string_view delimiter;
  string_view delimiter_00;
  vector<LinkedToken,_std::allocator<LinkedToken>_> linksfromThread;
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokensfromThread;
  string local_50;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&linksfromThread;
  p_Var1 = &(this->opTokens)._M_t._M_impl.super__Rb_tree_header;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->opTokens)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->links).super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threadId)._M_dataplus._M_p = (pointer)&(this->threadId).field_2;
  (this->threadId)._M_string_length = 0;
  (this->threadId).field_2._M_local_buf[0] = '\0';
  fmt.str_.size_ = (size_t)thread;
  fmt.str_.data_ = (char *)0x19;
  spdlog::info<std::__cxx11::string_const&>((spdlog *)"indexing new thread id {}",fmt,in_RCX);
  Thread::extractLinks(&linksfromThread,thread);
  delimiter._M_str = (char *)&linksfromThread;
  delimiter._M_len = (size_t)"\n";
  str::join<std::vector<LinkedToken,std::allocator<LinkedToken>>>
            ((string *)&tokensfromThread,(str *)0x1,delimiter,
             (vector<LinkedToken,_std::allocator<LinkedToken>_> *)in_R8);
  fmt_00.str_.size_ = (size_t)&tokensfromThread;
  fmt_00.str_.data_ = (char *)0x9;
  spdlog::info<std::__cxx11::string>((spdlog *)"links: {}",fmt_00,pbVar3);
  std::__cxx11::string::~string((string *)&tokensfromThread);
  moveInsert<LinkedToken>(&linksfromThread,&this->links);
  Thread::extractTokens(&tokensfromThread,thread);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokensfromThread;
  delimiter_00._M_str = (char *)pbVar3;
  delimiter_00._M_len = (size_t)"\n";
  str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
            (&local_50,(str *)0x1,delimiter_00,in_R8);
  fmt_01.str_.size_ = (size_t)&local_50;
  fmt_01.str_.data_ = (char *)0xa;
  spdlog::info<std::__cxx11::string>((spdlog *)0x161c9d,fmt_01,pbVar3);
  std::__cxx11::string::~string((string *)&local_50);
  moveInsert<Token>(&tokensfromThread,&this->opTokens);
  pCVar2 = (comments->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (newComment = (comments->super__Vector_base<Comment,_std::allocator<Comment>_>)._M_impl.
                    super__Vector_impl_data._M_start; newComment != pCVar2;
      newComment = newComment + 1) {
    addToIndex(this,newComment);
  }
  std::__cxx11::string::_M_assign((string *)&this->threadId);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree(&tokensfromThread._M_t);
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector(&linksfromThread);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}